

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaSSModel.cpp
# Opt level: O3

void __thiscall NaStateSpaceModel::Save(NaStateSpaceModel *this,NaDataStream *ds)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  size_t sVar4;
  NaReal *pNVar5;
  ulong uVar6;
  NaMatrix *pNVar7;
  NaReal NVar8;
  char szComment [100];
  char local_98 [104];
  
  NaDataStream::PutComment(ds," State space discrete time model:");
  NaDataStream::PutComment(ds,"   x(t+1) = A*x(t) + B*u(t)");
  NaDataStream::PutComment(ds,"   y(t)   = C*x(t) + D*u(t)");
  NaDataStream::PutComment(ds," Matrices: A(N,N), B(N,K), C(M,N), D(M,K)");
  NaDataStream::PutComment(ds,"   N - state vector, M - outputs, K - inputs");
  NaDataStream::PutF(ds,"Dimensions N M K","%u %u %u",(ulong)this->n,(ulong)this->m,(ulong)this->k);
  uVar1 = this->n;
  sprintf(local_98," Matrix A(%u,%u), %u numbers:",(ulong)uVar1,(ulong)uVar1,(ulong)(uVar1 * uVar1))
  ;
  NaDataStream::PutComment(ds,local_98);
  pNVar7 = &this->A;
  uVar1 = NaMatrix::dim_cols(pNVar7);
  pcVar3 = (char *)operator_new__((ulong)(uVar1 * 0x14));
  uVar1 = NaMatrix::dim_rows(pNVar7);
  if (uVar1 != 0) {
    uVar1 = 0;
    do {
      *pcVar3 = '\0';
      uVar2 = NaMatrix::dim_cols(pNVar7);
      if (uVar2 != 0) {
        uVar6 = 0;
        do {
          sVar4 = strlen(pcVar3);
          pNVar5 = NaMatrix::operator[](pNVar7,uVar1);
          sprintf(pcVar3 + sVar4," %g",pNVar5[uVar6]);
          uVar6 = uVar6 + 1;
          uVar2 = NaMatrix::dim_cols(pNVar7);
        } while (uVar6 < uVar2);
      }
      NaDataStream::PutF(ds,(char *)0x0,"%s",pcVar3);
      uVar1 = uVar1 + 1;
      uVar2 = NaMatrix::dim_rows(pNVar7);
    } while (uVar1 < uVar2);
  }
  operator_delete__(pcVar3);
  sprintf(local_98," Matrix B(%u,%u), %u numbers:",(ulong)this->n,(ulong)this->k,
          (ulong)(this->k * this->n));
  NaDataStream::PutComment(ds,local_98);
  pNVar7 = &this->B;
  uVar1 = NaMatrix::dim_cols(pNVar7);
  pcVar3 = (char *)operator_new__((ulong)(uVar1 * 0x14));
  uVar1 = NaMatrix::dim_rows(pNVar7);
  if (uVar1 != 0) {
    uVar1 = 0;
    do {
      *pcVar3 = '\0';
      uVar2 = NaMatrix::dim_cols(pNVar7);
      if (uVar2 != 0) {
        uVar6 = 0;
        do {
          sVar4 = strlen(pcVar3);
          pNVar5 = NaMatrix::operator[](pNVar7,uVar1);
          sprintf(pcVar3 + sVar4," %g",pNVar5[uVar6]);
          uVar6 = uVar6 + 1;
          uVar2 = NaMatrix::dim_cols(pNVar7);
        } while (uVar6 < uVar2);
      }
      NaDataStream::PutF(ds,(char *)0x0,"%s",pcVar3);
      uVar1 = uVar1 + 1;
      uVar2 = NaMatrix::dim_rows(pNVar7);
    } while (uVar1 < uVar2);
  }
  operator_delete__(pcVar3);
  sprintf(local_98," Matrix C(%u,%u), %u numbers:",(ulong)this->m,(ulong)this->n,
          (ulong)(this->n * this->m));
  NaDataStream::PutComment(ds,local_98);
  pNVar7 = &this->C;
  uVar1 = NaMatrix::dim_cols(pNVar7);
  pcVar3 = (char *)operator_new__((ulong)(uVar1 * 0x14));
  uVar1 = NaMatrix::dim_rows(pNVar7);
  if (uVar1 != 0) {
    uVar1 = 0;
    do {
      *pcVar3 = '\0';
      uVar2 = NaMatrix::dim_cols(pNVar7);
      if (uVar2 != 0) {
        uVar6 = 0;
        do {
          sVar4 = strlen(pcVar3);
          pNVar5 = NaMatrix::operator[](pNVar7,uVar1);
          sprintf(pcVar3 + sVar4," %g",pNVar5[uVar6]);
          uVar6 = uVar6 + 1;
          uVar2 = NaMatrix::dim_cols(pNVar7);
        } while (uVar6 < uVar2);
      }
      NaDataStream::PutF(ds,(char *)0x0,"%s",pcVar3);
      uVar1 = uVar1 + 1;
      uVar2 = NaMatrix::dim_rows(pNVar7);
    } while (uVar1 < uVar2);
  }
  operator_delete__(pcVar3);
  sprintf(local_98," Matrix D(%u,%u), %u numbers:",(ulong)this->m,(ulong)this->k,
          (ulong)(this->k * this->m));
  NaDataStream::PutComment(ds,local_98);
  pNVar7 = &this->D;
  uVar1 = NaMatrix::dim_cols(pNVar7);
  pcVar3 = (char *)operator_new__((ulong)(uVar1 * 0x14));
  uVar1 = NaMatrix::dim_rows(pNVar7);
  if (uVar1 != 0) {
    uVar1 = 0;
    do {
      *pcVar3 = '\0';
      uVar2 = NaMatrix::dim_cols(pNVar7);
      if (uVar2 != 0) {
        uVar6 = 0;
        do {
          sVar4 = strlen(pcVar3);
          pNVar5 = NaMatrix::operator[](pNVar7,uVar1);
          sprintf(pcVar3 + sVar4," %g",pNVar5[uVar6]);
          uVar6 = uVar6 + 1;
          uVar2 = NaMatrix::dim_cols(pNVar7);
        } while (uVar6 < uVar2);
      }
      NaDataStream::PutF(ds,(char *)0x0,"%s",pcVar3);
      uVar1 = uVar1 + 1;
      uVar2 = NaMatrix::dim_rows(pNVar7);
    } while (uVar1 < uVar2);
  }
  operator_delete__(pcVar3);
  NaDataStream::PutComment(ds," Initial state x(0):");
  uVar1 = this->n;
  pcVar3 = (char *)operator_new__((ulong)(uVar1 * 0x14));
  *pcVar3 = '\0';
  if (uVar1 != 0) {
    uVar1 = 0;
    do {
      uVar2 = NaVector::dim(&this->x0);
      NVar8 = 0.0;
      if (uVar1 < uVar2) {
        pNVar5 = NaVector::operator[](&this->x0,uVar1);
        NVar8 = *pNVar5;
      }
      sVar4 = strlen(pcVar3);
      sprintf(pcVar3 + sVar4," %g",NVar8);
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->n);
  }
  NaDataStream::PutF(ds,(char *)0x0,"%s",pcVar3);
  operator_delete__(pcVar3);
  return;
}

Assistant:

void
NaStateSpaceModel::Save (NaDataStream& ds)
{
    unsigned     i, j;
    char    *szBuf, szComment[100];

    ds.PutComment(" State space discrete time model:");
    ds.PutComment("   x(t+1) = A*x(t) + B*u(t)");
    ds.PutComment("   y(t)   = C*x(t) + D*u(t)");
    ds.PutComment(" Matrices: A(N,N), B(N,K), C(M,N), D(M,K)");
    ds.PutComment("   N - state vector, M - outputs, K - inputs");
    ds.PutF("Dimensions N M K", "%u %u %u", n, m, k);

    sprintf(szComment, " Matrix A(%u,%u), %u numbers:", n, n, n*n);
    ds.PutComment(szComment);
    szBuf = new char[20*A.dim_cols()];
    for(i = 0; i < A.dim_rows(); ++i){
        szBuf[0] = '\0';
        for(j = 0; j < A.dim_cols(); ++j){
            sprintf(szBuf + strlen(szBuf), " %g", A[i][j]);
        }
        ds.PutF(NULL, "%s", szBuf);
    }
    delete[] szBuf;

    sprintf(szComment, " Matrix B(%u,%u), %u numbers:", n, k, n*k);
    ds.PutComment(szComment);
    szBuf = new char[20*B.dim_cols()];
    for(i = 0; i < B.dim_rows(); ++i){
        szBuf[0] = '\0';
        for(j = 0; j < B.dim_cols(); ++j){
            sprintf(szBuf + strlen(szBuf), " %g", B[i][j]);
        }
        ds.PutF(NULL, "%s", szBuf);
    }
    delete[] szBuf;

    sprintf(szComment, " Matrix C(%u,%u), %u numbers:", m, n, m*n);
    ds.PutComment(szComment);
    szBuf = new char[20*C.dim_cols()];
    for(i = 0; i < C.dim_rows(); ++i){
        szBuf[0] = '\0';
        for(j = 0; j < C.dim_cols(); ++j){
            sprintf(szBuf + strlen(szBuf), " %g", C[i][j]);
        }
        ds.PutF(NULL, "%s", szBuf);
    }
    delete[] szBuf;

    sprintf(szComment, " Matrix D(%u,%u), %u numbers:", m, k, m*k);
    ds.PutComment(szComment);
    szBuf = new char[20*D.dim_cols()];
    for(i = 0; i < D.dim_rows(); ++i){
        szBuf[0] = '\0';
        for(j = 0; j < D.dim_cols(); ++j){
            sprintf(szBuf + strlen(szBuf), " %g", D[i][j]);
        }
        ds.PutF(NULL, "%s", szBuf);
    }
    delete[] szBuf;

    // Since x0 may be em[ty due to zero initial conditions, then
    // special algorithm to save it is used.
    ds.PutComment(" Initial state x(0):");
    szBuf = new char[20*n];
    szBuf[0] = '\0';
    for(i = 0; i < n; ++i){
	NaReal fX0i = (i < x0.dim())? x0[i]: 0.0;
	sprintf(szBuf + strlen(szBuf), " %g", fX0i);
    }
    ds.PutF(NULL, "%s", szBuf);
    delete[] szBuf;
}